

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doJSONPageLabels(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  bool bVar1;
  longlong lVar2;
  reference pQVar3;
  element_type *peVar4;
  allocator<char> local_1b9;
  string local_1b8;
  JSON local_198;
  allocator<char> local_181;
  JSON local_180 [2];
  JSON local_160;
  JSON local_150;
  allocator<char> local_139;
  JSON local_138 [2];
  JSON local_118;
  JSON local_108;
  undefined1 local_f8 [8];
  JSON j_label;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_e0;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_d8;
  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
  local_d0;
  iterator iter;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> labels;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_90;
  size_type local_78;
  longlong local_70;
  longlong npages;
  undefined1 local_58 [8];
  QPDFPageLabelDocumentHelper pldh;
  JSON j_labels;
  QPDF *pdf_local;
  bool *first_local;
  Pipeline *p_local;
  QPDFJob *this_local;
  
  JSON::makeArray();
  QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper
            ((QPDFPageLabelDocumentHelper *)local_58,pdf);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,pdf);
  QPDFPageDocumentHelper::getAllPages
            (&local_90,
             (QPDFPageDocumentHelper *)
             &labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  local_78 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                       (&local_90);
  lVar2 = QIntC::to_longlong<unsigned_long>(&local_78);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_90);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  local_70 = lVar2;
  bVar1 = QPDFPageLabelDocumentHelper::hasPageLabels((QPDFPageLabelDocumentHelper *)local_58);
  if (bVar1) {
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&iter);
    QPDFPageLabelDocumentHelper::getLabelsForPageRange
              ((QPDFPageLabelDocumentHelper *)local_58,0,local_70 + -1,0,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&iter);
    local_d0._M_current =
         (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&iter);
    while( true ) {
      local_d8._M_current =
           (QPDFObjectHandle *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&iter);
      bVar1 = __gnu_cxx::operator!=(&local_d0,&local_d8);
      if (!bVar1) break;
      local_e0 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator+(&local_d0,1);
      j_label.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                     ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&iter);
      bVar1 = __gnu_cxx::operator==
                        (&local_e0,
                         (__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                          *)&j_label.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
      if (bVar1) break;
      JSON::makeDictionary();
      JSON::addArrayElement
                ((JSON *)local_f8,
                 (JSON *)&pldh.m.
                          super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      JSON::~JSON(&local_108);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_138,"index",&local_139);
      pQVar3 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&local_d0);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_150,(int)pQVar3,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_118,(string *)local_f8,local_138);
      JSON::~JSON(&local_118);
      JSON::~JSON(&local_150);
      std::__cxx11::string::~string((string *)local_138);
      std::allocator<char>::~allocator(&local_139);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&local_d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_180,"label",&local_181);
      pQVar3 = __gnu_cxx::
               __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
               ::operator*(&local_d0);
      peVar4 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      QPDFObjectHandle::getJSON
                ((QPDFObjectHandle *)&local_198,(int)pQVar3,SUB41(peVar4->json_version,0));
      JSON::addDictionaryMember(&local_160,(string *)local_f8,local_180);
      JSON::~JSON(&local_160);
      JSON::~JSON(&local_198);
      std::__cxx11::string::~string((string *)local_180);
      std::allocator<char>::~allocator(&local_181);
      JSON::~JSON((JSON *)local_f8);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&local_d0);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&iter);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"pagelabels",&local_1b9);
  JSON::writeDictionaryItem
            (p,first,&local_1b8,
             (JSON *)&pldh.m.
                      super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,1);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper((QPDFPageLabelDocumentHelper *)local_58)
  ;
  JSON::~JSON((JSON *)&pldh.m.
                       super___shared_ptr<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  return;
}

Assistant:

void
QPDFJob::doJSONPageLabels(Pipeline* p, bool& first, QPDF& pdf)
{
    JSON j_labels = JSON::makeArray();
    QPDFPageLabelDocumentHelper pldh(pdf);
    long long npages = QIntC::to_longlong(QPDFPageDocumentHelper(pdf).getAllPages().size());
    if (pldh.hasPageLabels()) {
        std::vector<QPDFObjectHandle> labels;
        pldh.getLabelsForPageRange(0, npages - 1, 0, labels);
        for (auto iter = labels.begin(); iter != labels.end(); ++iter) {
            if ((iter + 1) == labels.end()) {
                // This can't happen, so ignore it. This could only happen if getLabelsForPageRange
                // somehow returned an odd number of items.
                break;
            }
            JSON j_label = j_labels.addArrayElement(JSON::makeDictionary());
            j_label.addDictionaryMember("index", (*iter).getJSON(m->json_version));
            ++iter;
            j_label.addDictionaryMember("label", (*iter).getJSON(m->json_version));
        }
    }
    JSON::writeDictionaryItem(p, first, "pagelabels", j_labels, 1);
}